

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall sznet::net::Channel::~Channel(Channel *this)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  
  if (this->m_eventHandling == true) {
    __assertion = "!m_eventHandling";
    __line = 0x1b;
  }
  else {
    if (this->m_addedToLoop != true) {
      bVar1 = EventLoop::isInLoopThread(this->m_loop);
      if (bVar1) {
        bVar1 = EventLoop::hasChannel(this->m_loop,this);
        if (bVar1) {
          __assertion = "!m_loop->hasChannel(this)";
          __line = 0x1f;
          goto LAB_001169a8;
        }
      }
      std::_Function_base::~_Function_base(&(this->m_errorCallback).super__Function_base);
      std::_Function_base::~_Function_base(&(this->m_closeCallback).super__Function_base);
      std::_Function_base::~_Function_base(&(this->m_writeCallback).super__Function_base);
      std::_Function_base::~_Function_base(&(this->m_readCallback).super__Function_base);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                (&(this->m_tie).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    __assertion = "!m_addedToLoop";
    __line = 0x1c;
  }
LAB_001169a8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
                ,__line,"sznet::net::Channel::~Channel()");
}

Assistant:

Channel::~Channel()
{
	assert(!m_eventHandling);
	assert(!m_addedToLoop);
	if (m_loop->isInLoopThread())
	{
		assert(!m_loop->hasChannel(this));
	}
}